

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::cleanUp(void)

{
  RegistryHub **ppRVar1;
  
  ppRVar1 = anon_unknown_27::getTheRegistryHub();
  if (*ppRVar1 != (RegistryHub *)0x0) {
    (*((*ppRVar1)->super_IRegistryHub)._vptr_IRegistryHub[1])();
  }
  ppRVar1 = anon_unknown_27::getTheRegistryHub();
  *ppRVar1 = (RegistryHub *)0x0;
  cleanUpContext();
  return;
}

Assistant:

void cleanUp() {
        delete getTheRegistryHub();
        getTheRegistryHub() = NULL;
        cleanUpContext();
    }